

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

string * __thiscall
fasttext::Dictionary::getLabel_abi_cxx11_
          (string *__return_storage_ptr__,Dictionary *this,int32_t lid)

{
  invalid_argument *this_00;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((-1 < lid) && (lid < this->nlabels_)) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               ((this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)lid + (long)this->nwords_));
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_78,this->nlabels_);
  std::operator+(&local_58,"Label id is out of range [0, ",&sStack_78);
  std::operator+(&local_38,&local_58,"]");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::string Dictionary::getLabel(int32_t lid) const {
  if (lid < 0 || lid >= nlabels_) {
    throw std::invalid_argument(
        "Label id is out of range [0, " + std::to_string(nlabels_) + "]");
  }
  return words_[lid + nwords_].word;
}